

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
           *this,DenseSetPair<llvm::StringRef> *OldBucketsBegin,
          DenseSetPair<llvm::StringRef> *OldBucketsEnd)

{
  bool bVar1;
  StringRef *pSVar2;
  StringRef *pSVar3;
  DenseSetPair<llvm::StringRef> *pDStack_98;
  bool FoundVal;
  DenseSetPair<llvm::StringRef> *DestBucket;
  char *local_88;
  char *local_80;
  size_t local_78;
  size_t local_70;
  char *local_68;
  char *local_60;
  size_t local_58;
  DenseSetPair<llvm::StringRef> *local_50;
  DenseSetPair<llvm::StringRef> *E;
  DenseSetPair<llvm::StringRef> *B;
  StringRef TombstoneKey;
  StringRef EmptyKey;
  DenseSetPair<llvm::StringRef> *OldBucketsEnd_local;
  DenseSetPair<llvm::StringRef> *OldBucketsBegin_local;
  DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
  *this_local;
  
  initEmpty(this);
  join_0x00000010_0x00000000_ = getEmptyKey();
  _B = getTombstoneKey();
  local_50 = OldBucketsEnd;
  E = OldBucketsBegin;
  do {
    if (E == local_50) {
      return;
    }
    pSVar2 = detail::DenseSetPair<llvm::StringRef>::getFirst(E);
    local_60 = pSVar2->Data;
    local_58 = pSVar2->Length;
    local_70 = TombstoneKey.Length;
    local_68 = EmptyKey.Data;
    bVar1 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar2,stack0xffffffffffffffd0);
    if (!bVar1) {
      pSVar2 = detail::DenseSetPair<llvm::StringRef>::getFirst(E);
      local_80 = pSVar2->Data;
      local_78 = pSVar2->Length;
      DestBucket = B;
      local_88 = TombstoneKey.Data;
      bVar1 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar2,_B);
      if (!bVar1) {
        pSVar2 = detail::DenseSetPair<llvm::StringRef>::getFirst(E);
        bVar1 = LookupBucketFor<llvm::StringRef>(this,pSVar2,&stack0xffffffffffffff68);
        if (bVar1) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                        ,0x176,
                        "void llvm::DenseMapBase<llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>]"
                       );
        }
        pSVar2 = detail::DenseSetPair<llvm::StringRef>::getFirst(E);
        pSVar3 = detail::DenseSetPair<llvm::StringRef>::getFirst(pDStack_98);
        pSVar3->Data = pSVar2->Data;
        pSVar3->Length = pSVar2->Length;
        detail::DenseSetPair<llvm::StringRef>::getSecond(pDStack_98);
        detail::DenseSetPair<llvm::StringRef>::getSecond(E);
        incrementNumEntries(this);
        detail::DenseSetPair<llvm::StringRef>::getSecond(E);
      }
    }
    detail::DenseSetPair<llvm::StringRef>::getFirst(E);
    E = E + 1;
  } while( true );
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }